

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ant.cpp
# Opt level: O2

void __thiscall imrt::Ant::generateReference(Ant *this)

{
  Collimator *pCVar1;
  double v;
  int iVar2;
  int iVar3;
  Station *this_00;
  pair<int,_int> p;
  mapped_type *this_01;
  int i;
  vector<int,_std::allocator<int>_> iaux;
  vector<int,_std::allocator<int>_> vaux;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  aux;
  int local_b4;
  int local_b0;
  int local_ac;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
  *local_88;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_80;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_60;
  
  local_80 = &this->ref_intensity;
  local_88 = &this->ref_plan;
  for (local_b0 = 0; local_b0 < this->n_stations; local_b0 = local_b0 + 1) {
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    this_00 = Plan::get_station(this->p,local_b0);
    for (local_b4 = 0; local_b4 < this->n_apertures; local_b4 = local_b4 + 1) {
      pCVar1 = this->collimator;
      v = Station::getApertureIntensity(this_00,local_b4);
      iVar2 = Collimator::getIntensityLevel(pCVar1,v);
      local_78._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,iVar2);
      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                ((vector<int,_std::allocator<int>_> *)&local_a8,(int *)&local_78);
      local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      iVar2 = 0;
      while( true ) {
        iVar3 = Collimator::getXdim(this->collimator);
        if (iVar3 <= iVar2) break;
        pCVar1 = this->collimator;
        p = Station::getApertureShape(this_00,local_b4,iVar2);
        local_ac = Collimator::searchReferenceIndex(pCVar1,p);
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)&local_78,&local_ac);
        iVar2 = iVar2 + 1;
      }
      this_01 = std::
                map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                              *)&local_60,&local_b4);
      std::vector<int,_std::allocator<int>_>::operator=
                (this_01,(vector<int,_std::allocator<int>_> *)&local_78);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(local_80,(value_type *)&local_a8);
    std::
    vector<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
    ::push_back(local_88,(value_type *)&local_60);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void Ant::generateReference() {
    Station * st;
    for (int s=0; s<n_stations; s++) {
      map <int, vector<int>> aux;
      vector <int> iaux;
      st = p->get_station(s);
      for (int a=0; a<n_apertures; a++) {
        // Set reference to intensity
        iaux.push_back(collimator.getIntensityLevel(st->getApertureIntensity(a)));
        
        // Set reference to aperture pattern
        vector <int> vaux;
        for (int i=0; i<collimator.getXdim(); i++) {
          vaux.push_back(collimator.searchReferenceIndex(st->getApertureShape(a,i)));
        }
        aux[a]=vaux;
      }
      ref_intensity.push_back(iaux);
      ref_plan.push_back(aux);
    }
    //printReferencePlan();
  }